

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accept.c
# Opt level: O2

mpt_input * mpt_accept(mpt_socket *socket)

{
  int __fd;
  mpt_input *pmVar1;
  mpt_socket local_14;
  
  pmVar1 = (mpt_input *)0x0;
  __fd = accept(socket->_id,(sockaddr *)0x0,(socklen_t *)0x0);
  if (-1 < __fd) {
    pmVar1 = mpt_stream_input(&local_14,0x32,0,2);
    if (pmVar1 == (mpt_input *)0x0) {
      close(__fd);
      pmVar1 = (mpt_input *)0x0;
    }
  }
  return pmVar1;
}

Assistant:

extern MPT_INTERFACE(input) *mpt_accept(const MPT_STRUCT(socket) *socket)
{
	static int flags = MPT_STREAMFLAG(RdWr) | MPT_STREAMFLAG(Buffer);
	MPT_STRUCT(socket) sock = MPT_SOCKET_INIT;
	MPT_INTERFACE(input) *in;
	int sockfd;
	
	if ((sockfd = accept(socket->_id, 0, 0)) < 0) {
		return 0;
	}
	sock._id = sockfd;
	
	/* bidirectional with 2 byte message ID */
	if (!(in = mpt_stream_input(&sock, flags, 0, sizeof(uint16_t)))) {
		(void) close(sockfd);
	}
	return in;
}